

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePrinter.cpp
# Opt level: O0

void __thiscall
slang::ast::TypePrinter::visit(TypePrinter *this,UnpackedUnionType *type,string_view overrideName)

{
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  format_string<const_int_&> fmt;
  bool bVar1;
  pointer pFVar2;
  Symbol *in_RSI;
  size_t in_RDI;
  char *in_stack_ffffffffffffff68;
  FormatBuffer *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff80;
  int *in_stack_ffffffffffffff90;
  FormatBuffer *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  Scope *in_stack_ffffffffffffffa8;
  TypePrinter *in_stack_ffffffffffffffb0;
  Scope *in_stack_ffffffffffffffd8;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  if (*(int *)(in_RDI + 8) == 1) {
    Symbol::getParentScope(in_RSI);
    printScope(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_10);
    if (bVar1) {
      pFVar2 = std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::
               operator->((unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
                           *)0xa6ee29);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)pFVar2,
                 in_stack_ffffffffffffff68);
      str._M_str = in_stack_ffffffffffffff80;
      str._M_len = in_RDI;
      FormatBuffer::append(pFVar2,str);
    }
    else {
      std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::operator->
                ((unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_> *)
                 0xa6ee66);
      str_00._M_str = in_stack_ffffffffffffff80;
      str_00._M_len = in_RDI;
      FormatBuffer::append(in_stack_ffffffffffffff70,str_00);
    }
  }
  else {
    pFVar2 = std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::
             operator->((unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
                         *)0xa6eea5);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff70,
               (char *)pFVar2);
    str_01._M_str = in_stack_ffffffffffffff80;
    str_01._M_len = in_RDI;
    FormatBuffer::append(in_stack_ffffffffffffff70,str_01);
    if (((ulong)in_RSI[2].parentScope & 0x100000000) != 0) {
      std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::operator->
                ((unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_> *)
                 0xa6eeee);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff70,
                 (char *)pFVar2);
      str_02._M_str = in_stack_ffffffffffffff80;
      str_02._M_len = in_RDI;
      FormatBuffer::append(in_stack_ffffffffffffff70,str_02);
    }
    appendMembers((TypePrinter *)in_RSI,in_stack_ffffffffffffffd8);
    if ((*(byte *)(in_RDI + 3) & 1) == 0) {
      bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_10);
      if (bVar1) {
        Symbol::getParentScope(in_RSI);
        printScope(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
        std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::operator->
                  ((unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_> *)
                   0xa6efb3);
        fmt.str.size_ = (size_t)in_stack_ffffffffffffffa8;
        fmt.str.data_ = in_stack_ffffffffffffffa0;
        FormatBuffer::format<int_const&>(in_stack_ffffffffffffff98,fmt,in_stack_ffffffffffffff90);
      }
      else {
        std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::operator->
                  ((unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_> *)
                   0xa6ef5d);
        str_03._M_str = in_stack_ffffffffffffff80;
        str_03._M_len = in_RDI;
        FormatBuffer::append(in_stack_ffffffffffffff70,str_03);
      }
    }
  }
  return;
}

Assistant:

void TypePrinter::visit(const UnpackedUnionType& type, std::string_view overrideName) {
    if (options.anonymousTypeStyle == TypePrintingOptions::FriendlyName) {
        printScope(type.getParentScope());

        if (overrideName.empty())
            buffer->append("<unnamed unpacked union>");
        else
            buffer->append(overrideName);
    }
    else {
        buffer->append("union");
        if (type.isTagged)
            buffer->append(" tagged");

        appendMembers(type);

        if (options.skipScopedTypeNames)
            ;
        else if (!overrideName.empty())
            buffer->append(overrideName);
        else {
            printScope(type.getParentScope());
            buffer->format("u${}", type.systemId);
        }
    }
}